

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O2

void StatsObserver::printTable(void)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::operator<<((ostream *)&std::cout,
                  "\n\n--------------------------------------------------------\n");
  std::operator<<((ostream *)&std::cout,"--------------------Game Statistics---------------------\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "--------------------------------------------------------\n\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Player",&local_d9);
  center(&local_58,&local_38,10);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_58);
  poVar1 = std::operator<<(poVar1," | ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Countries Owned",&local_da);
  center(&local_78,&local_98,0x14);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  poVar1 = std::operator<<(poVar1," | ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"% of the Map Owned",&local_db);
  center(&local_b8,&local_d8,0x14);
  poVar1 = std::operator<<(poVar1,(string *)&local_b8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  iVar2 = 0x38;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::operator<<((ostream *)&std::cout,"-");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  printStats();
  return;
}

Assistant:

void StatsObserver::printTable() {
    std::cout << "\n\n--------------------------------------------------------\n";
    std::cout << "--------------------Game Statistics---------------------\n";
    std::cout << "--------------------------------------------------------\n\n";

    std::cout << center("Player", 10) << " | "
              << center("Countries Owned", 20) << " | "
              << center("% of the Map Owned", 20) << "\n";

    for (int i = 0; i < 56; i++) {
        std::cout << "-";
    }
    std::cout << "\n";

    StatsObserver::printStats();
}